

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeFaceAreas
          (IntrinsicGeometryInterface *this)

{
  bool bVar1;
  SurfaceMesh *pSVar2;
  size_t sVar3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  double *pdVar7;
  long lVar8;
  size_t sVar9;
  runtime_error *this_00;
  long *plVar10;
  ulong uVar11;
  size_type *psVar12;
  long *plVar13;
  ParentMeshT *pPVar14;
  ulong uVar15;
  size_t sVar16;
  unsigned_long uVar17;
  size_t i;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  undefined1 local_e8 [24];
  long lStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->edgeLengthsQ).super_DependentQuantity.computed == false) {
    if ((this->edgeLengthsQ).super_DependentQuantity.evaluateFunc.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->edgeLengthsQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->edgeLengthsQ).super_DependentQuantity.evaluateFunc);
    (this->edgeLengthsQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Face,_double>::MeshData
            ((MeshData<geometrycentral::surface::Face,_double> *)local_e8,
             (this->super_BaseGeometryInterface).mesh);
  MeshData<geometrycentral::surface::Face,_double>::operator=
            (&this->faceAreas,(MeshData<geometrycentral::surface::Face,_double> *)local_e8);
  MeshData<geometrycentral::surface::Face,_double>::~MeshData
            ((MeshData<geometrycentral::surface::Face,_double> *)local_e8);
  pSVar2 = (this->super_BaseGeometryInterface).mesh;
  sVar3 = pSVar2->nFacesFillCount;
  if ((sVar3 == 0) ||
     (puVar4 = (pSVar2->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar4 != 0xffffffffffffffff)) {
    sVar9 = 0;
  }
  else {
    sVar16 = 0;
    do {
      sVar9 = sVar3;
      if (sVar3 - 1 == sVar16) break;
      sVar9 = sVar16 + 1;
      lVar8 = sVar16 + 1;
      sVar16 = sVar9;
    } while (puVar4[lVar8] == 0xffffffffffffffff);
  }
  if (sVar9 != sVar3) {
    auVar20 = ZEXT864(0) << 0x40;
    do {
      uVar5 = (pSVar2->fHalfedgeArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[sVar9];
      bVar1 = pSVar2->useImplicitTwinFlag;
      if (bVar1 == true) {
        uVar11 = uVar5 >> 1;
      }
      else {
        uVar11 = (pSVar2->heEdgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5];
      }
      puVar4 = (pSVar2->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = puVar4[uVar5];
      if (bVar1 == false) {
        uVar17 = (pSVar2->heEdgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6];
      }
      else {
        uVar17 = uVar6 >> 1;
      }
      uVar6 = puVar4[uVar6];
      if (bVar1 == false) {
        uVar15 = (pSVar2->heEdgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6];
      }
      else {
        uVar15 = uVar6 >> 1;
      }
      if (puVar4[uVar6] != uVar5) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]gc-polyscope-project-template/deps/geometry-central/src/surface/intrinsic_geometry_interface.cpp"
                   ,"");
        ::std::operator+(&local_70,"GC_SAFETY_ASSERT FAILURE from ",&local_b0);
        plVar10 = (long *)::std::__cxx11::string::append((char *)&local_70);
        local_128._M_dataplus._M_p = (pointer)*plVar10;
        psVar12 = (size_type *)(plVar10 + 2);
        if ((size_type *)local_128._M_dataplus._M_p == psVar12) {
          local_128.field_2._M_allocated_capacity = *psVar12;
          local_128.field_2._8_8_ = plVar10[3];
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar12;
        }
        local_128._M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        ::std::__cxx11::to_string(&local_90,0x4a);
        ::std::operator+(&local_50,&local_128,&local_90);
        plVar10 = (long *)::std::__cxx11::string::append((char *)&local_50);
        local_108 = (long *)*plVar10;
        plVar13 = plVar10 + 2;
        if (local_108 == plVar13) {
          local_f8 = *plVar13;
          lStack_f0 = plVar10[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *plVar13;
        }
        local_100 = plVar10[1];
        *plVar10 = (long)plVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)::std::__cxx11::string::append((char *)&local_108);
        local_e8._0_8_ = *plVar10;
        pPVar14 = (ParentMeshT *)(plVar10 + 2);
        if ((ParentMeshT *)local_e8._0_8_ == pPVar14) {
          local_e8._16_8_ = pPVar14->_vptr_SurfaceMesh;
          lStack_d0 = plVar10[3];
          local_e8._0_8_ = (ParentMeshT *)(local_e8 + 0x10);
        }
        else {
          local_e8._16_8_ = pPVar14->_vptr_SurfaceMesh;
        }
        local_e8._8_8_ = plVar10[1];
        *plVar10 = (long)pPVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        ::std::runtime_error::runtime_error(this_00,(string *)local_e8);
        __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      pdVar7 = (this->edgeLengths).data.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      dVar18 = (pdVar7[uVar11] + pdVar7[uVar17] + pdVar7[uVar15]) * 0.5;
      auVar19._8_8_ = 0;
      auVar19._0_8_ =
           (dVar18 - pdVar7[uVar15]) *
           (dVar18 - pdVar7[uVar17]) * dVar18 * (dVar18 - pdVar7[uVar11]);
      auVar19 = vmaxsd_avx(auVar19,auVar20._0_16_);
      if (auVar19._0_8_ < 0.0) {
        dVar18 = sqrt(auVar19._0_8_);
        auVar20 = ZEXT864(0) << 0x40;
      }
      else {
        auVar19 = vsqrtsd_avx(auVar19,auVar19);
        dVar18 = auVar19._0_8_;
      }
      (this->faceAreas).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_data[sVar9] = dVar18;
      sVar16 = sVar9;
      do {
        sVar9 = sVar3;
        if (sVar3 - 1 == sVar16) break;
        sVar9 = sVar16 + 1;
        lVar8 = sVar16 + 1;
        sVar16 = sVar9;
      } while ((pSVar2->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8] == 0xffffffffffffffff);
    } while (sVar9 != sVar3);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeFaceAreas() {
  edgeLengthsQ.ensureHave();

  // ONEDAY try these for better accuracy in near-degenerate triangles?
  // "Miscalculating Area and Angles of a Needle-like Triangle" https://www.cs.unc.edu/~snoeyink/c/c205/Triangle.pdf

  faceAreas = FaceData<double>(mesh);
  for (Face f : mesh.faces()) {
    // WARNING: Logic duplicated between cached and immediate version

    Halfedge he = f.halfedge();
    double a = edgeLengths[he.edge()];
    he = he.next();
    double b = edgeLengths[he.edge()];
    he = he.next();
    double c = edgeLengths[he.edge()];

    GC_SAFETY_ASSERT(he.next() == f.halfedge(), "faces must be triangular");

    // Herons formula
    double s = (a + b + c) / 2.0;
    double arg = s * (s - a) * (s - b) * (s - c);
    arg = std::fmax(0., arg);
    double area = std::sqrt(arg);

    faceAreas[f] = area;
  }
}